

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBuffer::EnsureWritableBytes(ByteBuffer *this,size_t min_writable_bytes)

{
  size_t __n;
  size_t sVar1;
  uchar *__src;
  overflow_error *this_00;
  uchar *__dest;
  ulong uVar2;
  
  CompactIfNeededToWriteBytes(this,min_writable_bytes);
  __n = this->writer_index_;
  sVar1 = this->capacity_;
  if (sVar1 - __n < min_writable_bytes) {
    uVar2 = sVar1 + (sVar1 == 0);
    while (uVar2 < min_writable_bytes + __n) {
      uVar2 = uVar2 * 2;
      if (uVar2 == 0) {
        this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_00,"Error: size exceeded 2GB");
        __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
    }
    __dest = (uchar *)operator_new__(uVar2);
    __src = this->buf_;
    memcpy(__dest,__src,__n);
    operator_delete(__src,1);
    this->buf_ = __dest;
    this->capacity_ = uVar2;
  }
  return;
}

Assistant:

void ByteBuffer::EnsureWritableBytes(size_t min_writable_bytes)
{
    CompactIfNeededToWriteBytes(min_writable_bytes);
    if (min_writable_bytes <= AvailableToWrite())
    {
        return;
    }

    size_t new_capacity;
    if (capacity_ == 0)
    {
        new_capacity = 1;
    }
    else
    {
        new_capacity = capacity_;
    }

    size_t min_new_capacity = writer_index_ + min_writable_bytes;
    while (new_capacity < min_new_capacity)
    {
        new_capacity <<= 1;
        if (new_capacity == 0) { throw std::overflow_error("Error: size exceeded 2GB"); }
    }

    unsigned char* copy_buff = new unsigned char[new_capacity];
    std::memcpy(copy_buff, buf_, writer_index_);
    delete(buf_);
    buf_ = copy_buff;
    capacity_ = new_capacity;
}